

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__newparam____gles_newparam
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  bool bVar1;
  newparam____gles_newparam__AttributeData *pnVar2;
  StringHash SVar3;
  xmlChar **ppxVar4;
  
  pnVar2 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL14::newparam____gles_newparam__AttributeData>
                     ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar4 = attributes->attributes;
  if (ppxVar4 != (xmlChar **)0x0) {
    for (; text = *ppxVar4, text != (ParserChar *)0x0; ppxVar4 = ppxVar4 + 2) {
      SVar3 = GeneratedSaxParser::Utils::calculateStringHash(text);
      if (SVar3 == 0x79f4) {
        pnVar2->sid = ppxVar4[1];
      }
      else {
        bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                           ERROR_UNKNOWN_ATTRIBUTE,0xce68f3d,text,ppxVar4[1]);
        if (bVar1) {
          return false;
        }
      }
    }
  }
  if ((pnVar2->sid == (ParserChar *)0x0) &&
     (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                         ERROR_REQUIRED_ATTRIBUTE_MISSING,0xce68f3d,0x79f4,(ParserChar *)0x0), bVar1
     )) {
    return false;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__newparam____gles_newparam( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__newparam____gles_newparam( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

newparam____gles_newparam__AttributeData* attributeData = newData<newparam____gles_newparam__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_sid:
    {

attributeData->sid = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->sid, strlen(attributeData->sid));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_NEWPARAM,
            HASH_ATTRIBUTE_sid,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_NEWPARAM, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( !attributeData->sid )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_NEWPARAM, HASH_ATTRIBUTE_sid, 0 ) )
        return false;
}


    return true;
}